

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_mem.c
# Opt level: O0

int check_size_argument_overflow(size_t nmemb,size_t size,size_t align)

{
  size_t sVar1;
  size_t in_RDX;
  ulong in_RSI;
  ulong in_RDI;
  size_t alloc_padding;
  undefined4 local_4;
  
  if (in_RDI == 0) {
    local_4 = 1;
  }
  else {
    sVar1 = GetAllocationPaddingSize(in_RDX);
    if ((0x200000000 - sVar1) / in_RDI < in_RSI) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int check_size_argument_overflow(size_t nmemb, size_t size,
                                        size_t align) {
  if (nmemb == 0) return 1;
  const size_t alloc_padding = GetAllocationPaddingSize(align);
#if defined(AOM_MAX_ALLOCABLE_MEMORY)
  assert(AOM_MAX_ALLOCABLE_MEMORY >= alloc_padding);
  assert(AOM_MAX_ALLOCABLE_MEMORY <= SIZE_MAX);
  if (size > (AOM_MAX_ALLOCABLE_MEMORY - alloc_padding) / nmemb) return 0;
#else
  if (size > (SIZE_MAX - alloc_padding) / nmemb) return 0;
#endif
  return 1;
}